

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csp_if_zmqhub.c
# Opt level: O2

int csp_zmqhub_init_filter2
              (char *ifname,char *host,uint16_t addr,uint16_t netmask,int promisc,
              csp_iface_t **return_interface,char *sec_key,uint16_t subport,uint16_t pubport)

{
  csp_iface_t *pcVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  pthread_t *ppVar5;
  pthread_t pVar6;
  undefined6 in_register_00000012;
  ushort *puVar7;
  ushort *puVar8;
  char *__src;
  long lVar9;
  int idle;
  pthread_t *local_170;
  csp_iface_t *local_168;
  csp_iface_t **local_160;
  int intvl;
  int cnt;
  int keep_alive;
  pthread_attr_t attributes;
  char pub [100];
  char sub [100];
  
  local_160 = return_interface;
  csp_zmqhub_make_endpoint(host,subport,pub,100);
  csp_zmqhub_make_endpoint(host,pubport,sub,100);
  ppVar5 = (pthread_t *)calloc(1,0x90);
  __src = "ZMQHUB";
  if (ifname != (char *)0x0) {
    __src = ifname;
  }
  strncpy((char *)(ppVar5 + 4),__src,10);
  ppVar5[7] = (pthread_t)(ppVar5 + 4);
  ppVar5[9] = (pthread_t)ppVar5;
  ppVar5[10] = (pthread_t)csp_zmqhub_tx;
  pVar6 = zmq_ctx_new();
  ppVar5[1] = pVar6;
  csp_print_func("  ZMQ init %s: addr: %u, pub(tx): [%s], sub(rx): [%s]\n",ppVar5[7],
                 CONCAT62(in_register_00000012,addr) & 0xffffffff,pub,sub);
  pVar6 = zmq_socket(ppVar5[1],1);
  ppVar5[2] = pVar6;
  pVar6 = zmq_socket(ppVar5[1],2);
  ppVar5[3] = pVar6;
  if (sec_key != (char *)0x0) {
    zmq_curve_public(&attributes,sec_key);
    zmq_setsockopt(ppVar5[2],0x32,&attributes,0x29);
    zmq_setsockopt(ppVar5[2],0x30,&attributes,0x29);
    zmq_setsockopt(ppVar5[2],0x31,sec_key,0x29);
    zmq_setsockopt(ppVar5[3],0x32,&attributes,0x29);
    zmq_setsockopt(ppVar5[3],0x30,&attributes,0x29);
    zmq_setsockopt(ppVar5[3],0x31,sec_key,0x29);
  }
  local_168 = (csp_iface_t *)(ppVar5 + 6);
  keep_alive = 1;
  idle = 900;
  cnt = 2;
  intvl = 900;
  zmq_setsockopt(ppVar5[2],0x22,&keep_alive,4);
  zmq_setsockopt(ppVar5[2],0x24,&idle,4);
  zmq_setsockopt(ppVar5[2],0x23,&cnt,4);
  zmq_setsockopt(ppVar5[2],0x25,&intvl,4);
  zmq_setsockopt(ppVar5[3],0x22,&keep_alive,4);
  zmq_setsockopt(ppVar5[3],0x24,&idle,4);
  zmq_setsockopt(ppVar5[3],0x23,&cnt,4);
  zmq_setsockopt(ppVar5[3],0x25,&intvl,4);
  uVar4 = csp_id_get_host_bits();
  zmq_connect(ppVar5[2],pub);
  zmq_connect(ppVar5[3],sub);
  local_170 = ppVar5;
  if (promisc == 0) {
    uVar2 = 0;
    for (lVar9 = 0; lVar9 != 0x18; lVar9 = lVar9 + 6) {
      puVar7 = (ushort *)((long)csp_zmqhub_init_filter2::filt[0] + lVar9 + 2);
      uVar3 = uVar2 | addr | ~(ushort)(-1 << ((char)uVar4 - (char)netmask & 0x1fU));
      *(uint16_t *)((long)csp_zmqhub_init_filter2::filt[0] + lVar9) =
           addr << 8 | (uVar2 | addr) >> 8;
      *puVar7 = uVar3 << 8 | uVar3 >> 8;
      puVar8 = (ushort *)((long)csp_zmqhub_init_filter2::filt[0] + lVar9 + 4);
      *puVar8 = (ushort)(uVar2 + 0x3fff) >> 8 | 0xff00;
      zmq_setsockopt(ppVar5[3],6,(long)csp_zmqhub_init_filter2::filt[0] + lVar9,2);
      zmq_setsockopt(ppVar5[3],6,puVar7,2);
      zmq_setsockopt(ppVar5[3],6,puVar8,2);
      uVar2 = uVar2 + 0x4000;
    }
  }
  else {
    zmq_setsockopt(ppVar5[3],6,0,0);
  }
  pthread_attr_init((pthread_attr_t *)&attributes);
  pthread_attr_setdetachstate((pthread_attr_t *)&attributes,1);
  pthread_create(local_170,(pthread_attr_t *)&attributes,csp_zmqhub_task,local_170);
  pcVar1 = local_168;
  csp_iflist_add(local_168);
  if (local_160 != (csp_iface_t **)0x0) {
    *local_160 = pcVar1;
  }
  return 0;
}

Assistant:

int csp_zmqhub_init_filter2(const char * ifname, const char * host, uint16_t addr, uint16_t netmask, int promisc, csp_iface_t ** return_interface, char * sec_key, uint16_t subport, uint16_t pubport) {
	
	char pub[100];
	csp_zmqhub_make_endpoint(host, subport, pub, sizeof(pub));

	char sub[100];
	csp_zmqhub_make_endpoint(host, pubport, sub, sizeof(sub));

	int ret;
	pthread_attr_t attributes;
	zmq_driver_t * drv = calloc(1, sizeof(*drv));
	assert(drv != NULL);

	if (ifname == NULL) {
		ifname = CSP_ZMQHUB_IF_NAME;
	}

	strncpy(drv->name, ifname, sizeof(drv->name) - 1);
	drv->iface.name = drv->name;
	drv->iface.driver_data = drv;
	drv->iface.nexthop = csp_zmqhub_tx;

	drv->context = zmq_ctx_new();
	assert(drv->context != NULL);

	csp_print("  ZMQ init %s: addr: %u, pub(tx): [%s], sub(rx): [%s]\n", drv->iface.name, addr, pub, sub);

	/* Publisher (TX) */
	drv->publisher = zmq_socket(drv->context, ZMQ_PUB);
	assert(drv->publisher != NULL);

	/* Subscriber (RX) */
	drv->subscriber = zmq_socket(drv->context, ZMQ_SUB);
	assert(drv->subscriber != NULL);

	/* If shared secret key provided */
	if (sec_key) {
		char pub_key[41];

		zmq_curve_public(pub_key, sec_key);
		/* Publisher (TX) */
		zmq_setsockopt(drv->publisher, ZMQ_CURVE_SERVERKEY, pub_key, CURVE_KEYLEN);
		zmq_setsockopt(drv->publisher, ZMQ_CURVE_PUBLICKEY, pub_key, CURVE_KEYLEN);
		zmq_setsockopt(drv->publisher, ZMQ_CURVE_SECRETKEY, sec_key, CURVE_KEYLEN);
		/* Subscriber (RX) */
		zmq_setsockopt(drv->subscriber, ZMQ_CURVE_SERVERKEY, pub_key, CURVE_KEYLEN);
		zmq_setsockopt(drv->subscriber, ZMQ_CURVE_PUBLICKEY, pub_key, CURVE_KEYLEN);
		zmq_setsockopt(drv->subscriber, ZMQ_CURVE_SECRETKEY, sec_key, CURVE_KEYLEN);
	}
	int keep_alive = 1;
	/* Time in seconds a connection must be idle before keep-alive packet send*/
	int idle = 900;
	/* Maximum number of keep-alive probes to send without ack before connection closed */
	int cnt = 2;
	/* Interval in seconds between each keep-alive probe */
	int intvl = 900;
	/* Publisher (TX) */
	zmq_setsockopt(drv->publisher, ZMQ_TCP_KEEPALIVE, &keep_alive, sizeof(keep_alive));
	zmq_setsockopt(drv->publisher, ZMQ_TCP_KEEPALIVE_IDLE, &idle, sizeof(idle));
	zmq_setsockopt(drv->publisher, ZMQ_TCP_KEEPALIVE_CNT, &cnt, sizeof(cnt));
	zmq_setsockopt(drv->publisher, ZMQ_TCP_KEEPALIVE_INTVL, &intvl, sizeof(intvl));
	/* Subscriber (RX) */
	zmq_setsockopt(drv->subscriber, ZMQ_TCP_KEEPALIVE, &keep_alive, sizeof(keep_alive));
	zmq_setsockopt(drv->subscriber, ZMQ_TCP_KEEPALIVE_IDLE, &idle, sizeof(idle));
	zmq_setsockopt(drv->subscriber, ZMQ_TCP_KEEPALIVE_CNT, &cnt, sizeof(cnt));
	zmq_setsockopt(drv->subscriber, ZMQ_TCP_KEEPALIVE_INTVL, &intvl, sizeof(intvl));

	/* Generate filters */
	uint16_t hostmask = (1 << (csp_id_get_host_bits() - netmask)) - 1;
	
	/* Connect to server */
	ret = zmq_connect(drv->publisher, pub);
	assert(ret == 0);
	ret = zmq_connect(drv->subscriber, sub);
	assert(ret == 0);
	(void)ret;

	if (promisc) {

		// subscribe to all packets - no filter
		ret = zmq_setsockopt(drv->subscriber, ZMQ_SUBSCRIBE, NULL, 0);
		assert(ret == 0);

	} else {

		/* This needs to be static, because ZMQ does not copy the filter value to the
		 * outgoing packet for each setsockopt call */
		static uint16_t filt[4][3];

		for (int i = 0; i < 4; i++) {
			//int i = CSP_PRIO_NORM;
			filt[i][0] = __builtin_bswap16((i << 14) | addr);
			filt[i][1] = __builtin_bswap16((i << 14) | addr | hostmask);
			filt[i][2] = __builtin_bswap16((i << 14) | 16383);
			ret = zmq_setsockopt(drv->subscriber, ZMQ_SUBSCRIBE, &filt[i][0], 2);
			ret = zmq_setsockopt(drv->subscriber, ZMQ_SUBSCRIBE, &filt[i][1], 2);
			ret = zmq_setsockopt(drv->subscriber, ZMQ_SUBSCRIBE, &filt[i][2], 2);
		}

	} 


	/* Start RX thread */
	ret = pthread_attr_init(&attributes);
	assert(ret == 0);
	ret = pthread_attr_setdetachstate(&attributes, PTHREAD_CREATE_DETACHED);
	assert(ret == 0);
	ret = pthread_create(&drv->rx_thread, &attributes, csp_zmqhub_task, drv);
	assert(ret == 0);

	/* Register interface */
	csp_iflist_add(&drv->iface);

	if (return_interface) {
		*return_interface = &drv->iface;
	}

	return CSP_ERR_NONE;
}